

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&> *
testing::internal::
MatcherCastImpl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_testing::PolymorphicMatcher<testing::internal::MatchesRegexMatcher>_>
::Cast(PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *polymorphic_matcher_or_value)

{
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *in_RDI;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *pPVar1;
  undefined1 local_28 [40];
  
  pPVar1 = in_RDI;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher>::PolymorphicMatcher(in_RDI,in_RDI);
  CastImpl(pPVar1,local_28);
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher>::~PolymorphicMatcher
            ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)0x22ed74);
  return (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *)in_RDI;
}

Assistant:

static Matcher<T> Cast(M polymorphic_matcher_or_value) {
    // M can be a polymorhic matcher, in which case we want to use
    // its conversion operator to create Matcher<T>.  Or it can be a value
    // that should be passed to the Matcher<T>'s constructor.
    //
    // We can't call Matcher<T>(polymorphic_matcher_or_value) when M is a
    // polymorphic matcher because it'll be ambiguous if T has an implicit
    // constructor from M (this usually happens when T has an implicit
    // constructor from any type).
    //
    // It won't work to unconditionally implict_cast
    // polymorphic_matcher_or_value to Matcher<T> because it won't trigger
    // a user-defined conversion from M to T if one exists (assuming M is
    // a value).
    return CastImpl(
        polymorphic_matcher_or_value,
        BooleanConstant<
            internal::ImplicitlyConvertible<M, Matcher<T> >::value>());
  }